

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O3

bool __thiscall HighsSparseMatrix::debugPartitionOk(HighsSparseMatrix *this,int8_t *in_partition)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  
  if (0 < (long)this->num_row_) {
    piVar2 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar5 = *piVar2;
    lVar4 = 0;
    do {
      iVar1 = (this->p_end_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar4];
      if (iVar5 < iVar1) {
        lVar6 = 0;
        do {
          if (in_partition[piVar3[iVar5 + lVar6]] == '\0') {
            return false;
          }
          lVar6 = lVar6 + 1;
        } while (iVar1 - iVar5 != (int)lVar6);
      }
      iVar5 = piVar2[lVar4 + 1];
      if (iVar1 < iVar5) {
        lVar6 = 0;
        do {
          if (in_partition[piVar3[iVar1 + lVar6]] != '\0') {
            return false;
          }
          lVar6 = lVar6 + 1;
        } while (iVar5 - iVar1 != (int)lVar6);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != this->num_row_);
  }
  return true;
}

Assistant:

bool HighsSparseMatrix::debugPartitionOk(const int8_t* in_partition) const {
  assert(this->format_ == MatrixFormat::kRowwisePartitioned);
  bool ok = true;
  for (HighsInt iRow = 0; iRow < this->num_row_; iRow++) {
    for (HighsInt iEl = this->start_[iRow]; iEl < this->p_end_[iRow]; iEl++) {
      if (!in_partition[this->index_[iEl]]) {
        ok = false;
        break;
      }
    }
    if (!ok) break;
    for (HighsInt iEl = this->p_end_[iRow]; iEl < this->start_[iRow + 1];
         iEl++) {
      if (in_partition[this->index_[iEl]]) {
        ok = false;
        break;
      }
    }
    if (!ok) break;
  }
  return ok;
}